

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldLiteGenerator::
ImmutableLazyMessageOneofFieldLiteGenerator
          (ImmutableLazyMessageOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  OneofGeneratorInfo *info;
  mapped_type *pmVar1;
  key_type local_38;
  
  ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator
            ((ImmutableMessageFieldLiteGenerator *)this,descriptor,messageBitIndex,builderBitIndex,
             context);
  (this->super_ImmutableLazyMessageFieldLiteGenerator).super_ImmutableMessageFieldLiteGenerator.
  super_ImmutableFieldLiteGenerator._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableLazyMessageOneofFieldLiteGenerator_004286f0;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x60));
  variables = &(this->super_ImmutableLazyMessageFieldLiteGenerator).
               super_ImmutableMessageFieldLiteGenerator.variables_;
  SetCommonOneofVariables(descriptor,info,variables);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lazy_type","");
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_38);
  std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x38890a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ImmutableLazyMessageOneofFieldLiteGenerator::
ImmutableLazyMessageOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                            int messageBitIndex,
                                            int builderBitIndex,
                                            Context* context)
    : ImmutableLazyMessageFieldLiteGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
  variables_["lazy_type"] = "com.google.protobuf.LazyFieldLite";
}